

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

uint64_t arena_decay_compute_purge_interval_impl
                   (tsdn_t *tsdn,arena_decay_t *decay,extents_t *extents)

{
  long lVar1;
  undefined1 auVar2 [16];
  _Bool _Var3;
  uint64_t uVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  
  _Var3 = malloc_mutex_trylock(tsdn,&decay->mtx);
  if (_Var3) {
    uVar4 = 100000000;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    if (0 < (decay->time_ms).repr) {
      uVar4 = nstime_ns(&decay->interval);
      sVar5 = extents_npages_get(extents);
      if (sVar5 == 0) {
        lVar9 = 0x15;
        do {
          if (lVar9 == 0xdd) goto LAB_00113a8f;
          lVar1 = lVar9 * 8;
          lVar9 = lVar9 + 1;
        } while (*(long *)((long)&(decay->mtx).field_0 + lVar1) == 0);
      }
      if (sVar5 < 0x401) {
        uVar6 = uVar4 * 200;
      }
      else {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100000000)) / auVar2,0);
        sVar5 = 2;
        if (2 < uVar6) {
          sVar5 = uVar6;
        }
        uVar6 = 100000000;
        if (0x7aaf0 < uVar4 && 100000000 < uVar4 * 200) {
          sVar7 = decay_npurge_after_interval(decay,sVar5);
          if (sVar7 < 0x401) {
            sVar8 = decay_npurge_after_interval(decay,200);
            uVar12 = 200;
            uVar6 = uVar4 * 200;
            if (0x3ff < sVar8) {
              while ((sVar11 = sVar7, sVar10 = sVar5, sVar11 + 0x400 < sVar8 &&
                     (sVar10 + 2 < uVar12))) {
                uVar6 = uVar12 + sVar10 >> 1;
                sVar7 = decay_npurge_after_interval(decay,uVar6);
                sVar5 = uVar6;
                if (0x400 < sVar7) {
                  sVar8 = sVar7;
                  sVar5 = sVar10;
                  sVar7 = sVar11;
                  uVar12 = uVar6;
                }
              }
              uVar6 = (uVar12 + sVar10) * uVar4 >> 1;
            }
          }
          else {
            uVar6 = sVar5 * uVar4;
          }
        }
      }
    }
LAB_00113a8f:
    uVar4 = 100000000;
    if (100000000 < uVar6) {
      uVar4 = uVar6;
    }
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40));
  }
  return uVar4;
}

Assistant:

static uint64_t
arena_decay_compute_purge_interval_impl(tsdn_t *tsdn, arena_decay_t *decay,
    extents_t *extents) {
	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* Use minimal interval if decay is contended. */
		return BACKGROUND_THREAD_MIN_INTERVAL_NS;
	}

	uint64_t interval;
	ssize_t decay_time = atomic_load_zd(&decay->time_ms, ATOMIC_RELAXED);
	if (decay_time <= 0) {
		/* Purging is eagerly done or disabled currently. */
		interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
		goto label_done;
	}

	uint64_t decay_interval_ns = nstime_ns(&decay->interval);
	assert(decay_interval_ns > 0);
	size_t npages = extents_npages_get(extents);
	if (npages == 0) {
		unsigned i;
		for (i = 0; i < SMOOTHSTEP_NSTEPS; i++) {
			if (decay->backlog[i] > 0) {
				break;
			}
		}
		if (i == SMOOTHSTEP_NSTEPS) {
			/* No dirty pages recorded.  Sleep indefinitely. */
			interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
			goto label_done;
		}
	}
	if (npages <= BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		/* Use max interval. */
		interval = decay_interval_ns * SMOOTHSTEP_NSTEPS;
		goto label_done;
	}

	size_t lb = BACKGROUND_THREAD_MIN_INTERVAL_NS / decay_interval_ns;
	size_t ub = SMOOTHSTEP_NSTEPS;
	/* Minimal 2 intervals to ensure reaching next epoch deadline. */
	lb = (lb < 2) ? 2 : lb;
	if ((decay_interval_ns * ub <= BACKGROUND_THREAD_MIN_INTERVAL_NS) ||
	    (lb + 2 > ub)) {
		interval = BACKGROUND_THREAD_MIN_INTERVAL_NS;
		goto label_done;
	}

	assert(lb + 2 <= ub);
	size_t npurge_lb, npurge_ub;
	npurge_lb = decay_npurge_after_interval(decay, lb);
	if (npurge_lb > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * lb;
		goto label_done;
	}
	npurge_ub = decay_npurge_after_interval(decay, ub);
	if (npurge_ub < BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * ub;
		goto label_done;
	}

	unsigned n_search = 0;
	size_t target, npurge;
	while ((npurge_lb + BACKGROUND_THREAD_NPAGES_THRESHOLD < npurge_ub)
	    && (lb + 2 < ub)) {
		target = (lb + ub) / 2;
		npurge = decay_npurge_after_interval(decay, target);
		if (npurge > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
			ub = target;
			npurge_ub = npurge;
		} else {
			lb = target;
			npurge_lb = npurge;
		}
		assert(n_search++ < lg_floor(SMOOTHSTEP_NSTEPS) + 1);
	}
	interval = decay_interval_ns * (ub + lb) / 2;
label_done:
	interval = (interval < BACKGROUND_THREAD_MIN_INTERVAL_NS) ?
	    BACKGROUND_THREAD_MIN_INTERVAL_NS : interval;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return interval;
}